

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<float> * __thiscall
qclab::dense::SquareMatrix<float>::operator=(SquareMatrix<float> *this,SquareMatrix<float> *matrix)

{
  float fVar1;
  int64_t iVar2;
  float *pfVar3;
  type pfVar4;
  size_t local_30;
  int64_t i;
  float *data;
  SquareMatrix<float> *local_18;
  SquareMatrix<float> *matrix_local;
  SquareMatrix<float> *this_local;
  
  local_18 = matrix;
  matrix_local = this;
  iVar2 = size(matrix);
  if (iVar2 != this->size_) {
    iVar2 = size(local_18);
    this->size_ = iVar2;
    alloc_unique_array<float>((dense *)&data,this->size_ * this->size_);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::operator=
              (&this->data_,(unique_ptr<float[],_std::default_delete<float[]>_> *)&data);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&data);
  }
  pfVar3 = ptr(local_18);
  for (local_30 = 0; (long)local_30 < this->size_ * this->size_; local_30 = local_30 + 1) {
    fVar1 = pfVar3[local_30];
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->data_,local_30);
    *pfVar4 = fVar1;
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }